

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrthogonalPackingSolver2D.h
# Opt level: O2

void __thiscall
tsbp::OrthogonalPackingSolver2D::OrthogonalPackingSolver2D
          (OrthogonalPackingSolver2D *this,
          vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items,Bin *container,
          InputParameters *inputParameters)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::vector(&this->items,items);
  iVar3 = (container->super_Rectangle).X;
  iVar4 = (container->super_Rectangle).Y;
  iVar5 = (container->super_Rectangle).Dx;
  iVar6 = (container->super_Rectangle).Dy;
  iVar2 = (container->super_Rectangle).ExternId;
  dVar1 = (container->super_Rectangle).Area;
  (this->container).super_Rectangle.InternId = (container->super_Rectangle).InternId;
  (this->container).super_Rectangle.ExternId = iVar2;
  (this->container).super_Rectangle.Area = dVar1;
  (this->container).super_Rectangle.X = iVar3;
  (this->container).super_Rectangle.Y = iVar4;
  (this->container).super_Rectangle.Dx = iVar5;
  (this->container).super_Rectangle.Dy = iVar6;
  InputParameters::InputParameters(&this->inputParameters,inputParameters);
  memset(&this->solutionStatistics,0,200);
  (this->solution).ReducedItemInfeasiblePlacementPoints = 0xffffffffffffffff;
  (this->solution).IsReducedItemPlaced = false;
  (this->solution).IsFixedItemPlaced = false;
  (this->branchAndBoundSearch)._M_t.
  super___uniq_ptr_impl<tsbp::IBranchAndBoundSolver,_std::default_delete<tsbp::IBranchAndBoundSolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_tsbp::IBranchAndBoundSolver_*,_std::default_delete<tsbp::IBranchAndBoundSolver>_>
  .super__Head_base<0UL,_tsbp::IBranchAndBoundSolver_*,_false>._M_head_impl =
       (IBranchAndBoundSolver *)0x0;
  return;
}

Assistant:

OrthogonalPackingSolver2D(const std::vector<Rectangle>& items, const Bin& container, const InputParameters& inputParameters)
        :
        items(items),
        container(container),
        inputParameters(inputParameters) {}